

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetISO8601
          (TimeZoneFormat *this,UnicodeString *text,ParsePosition *pos,UBool extendedOnly,
          UBool *hasDigitOffset)

{
  short sVar1;
  int offset;
  char16_t cVar2;
  int iVar3;
  int32_t iVar4;
  int32_t iVar5;
  ParsePosition posOffset;
  ParsePosition posBasic;
  
  if (hasDigitOffset != (UBool *)0x0) {
    *hasDigitOffset = '\0';
  }
  offset = pos->index;
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (text->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if (iVar3 <= offset) {
LAB_0020550b:
    pos->errorIndex = offset;
    return 0;
  }
  cVar2 = UnicodeString::doCharAt(text,offset);
  if ((cVar2 & 0xffdfU) == 0x5a) {
    pos->index = offset + 1;
    return 0;
  }
  if (cVar2 == L'+') {
    iVar3 = 1;
  }
  else {
    if (cVar2 != L'-') goto LAB_0020550b;
    iVar3 = -1;
  }
  posOffset.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003aa3b0;
  posOffset.errorIndex = -1;
  posOffset.index = offset + 1;
  iVar4 = parseAsciiOffsetFields(text,&posOffset,L':',FIELDS_H,FIELDS_HMS);
  if (extendedOnly == '\0' && posOffset.errorIndex == -1) {
    if (posOffset.index - offset < 4) {
      posBasic.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003aa3b0;
      posBasic.errorIndex = -1;
      posBasic.index = offset + 1;
      iVar5 = parseAbuttingAsciiOffsetFields(text,&posBasic,FIELDS_H,FIELDS_HMS,'\0');
      if ((posBasic.errorIndex == -1) && (posOffset.index < posBasic.index)) {
        posOffset.index = posBasic.index;
        iVar4 = iVar5;
      }
      ParsePosition::~ParsePosition(&posBasic);
      goto LAB_002055cc;
    }
  }
  else {
LAB_002055cc:
    if (posOffset.errorIndex != -1) {
      pos->errorIndex = offset;
      iVar4 = 0;
      goto LAB_002055ee;
    }
  }
  pos->index = posOffset.index;
  if (hasDigitOffset != (UBool *)0x0) {
    *hasDigitOffset = '\x01';
  }
  iVar4 = iVar4 * iVar3;
LAB_002055ee:
  ParsePosition::~ParsePosition(&posOffset);
  return iVar4;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetISO8601(const UnicodeString& text, ParsePosition& pos, UBool extendedOnly, UBool* hasDigitOffset /* = NULL */) const {
    if (hasDigitOffset) {
        *hasDigitOffset = FALSE;
    }
    int32_t start = pos.getIndex();
    if (start >= text.length()) {
        pos.setErrorIndex(start);
        return 0;
    }

    UChar firstChar = text.charAt(start);
    if (firstChar == ISO8601_UTC || firstChar == (UChar)(ISO8601_UTC + 0x20)) {
        // "Z" (or "z") - indicates UTC
        pos.setIndex(start + 1);
        return 0;
    }

    int32_t sign = 1;
    if (firstChar == PLUS) {
        sign = 1;
    } else if (firstChar == MINUS) {
        sign = -1;
    } else {
        // Not an ISO 8601 offset string
        pos.setErrorIndex(start);
        return 0;
    }
    ParsePosition posOffset(start + 1);
    int32_t offset = parseAsciiOffsetFields(text, posOffset, ISO8601_SEP, FIELDS_H, FIELDS_HMS);
    if (posOffset.getErrorIndex() == -1 && !extendedOnly && (posOffset.getIndex() - start <= 3)) {
        // If the text is successfully parsed as extended format with the options above, it can be also parsed
        // as basic format. For example, "0230" can be parsed as offset 2:00 (only first digits are valid for
        // extended format), but it can be parsed as offset 2:30 with basic format. We use longer result.
        ParsePosition posBasic(start + 1);
        int32_t tmpOffset = parseAbuttingAsciiOffsetFields(text, posBasic, FIELDS_H, FIELDS_HMS, FALSE);
        if (posBasic.getErrorIndex() == -1 && posBasic.getIndex() > posOffset.getIndex()) {
            offset = tmpOffset;
            posOffset.setIndex(posBasic.getIndex());
        }
    }

    if (posOffset.getErrorIndex() != -1) {
        pos.setErrorIndex(start);
        return 0;
    }

    pos.setIndex(posOffset.getIndex());
    if (hasDigitOffset) {
        *hasDigitOffset = TRUE;
    }
    return sign * offset;
}